

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::~basic_cbor_parser
          (basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *this)

{
  ~basic_cbor_parser(this);
  operator_delete(this,0xf8);
  return;
}

Assistant:

~basic_cbor_parser() = default;